

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> __thiscall
capnp::SchemaLoader::Impl::makeBrandedDependencies
          (Impl *this,RawSchema *schema,
          Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *bindings)

{
  uint uVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  RawBrandedSchema *pRVar5;
  Reader brand;
  Reader type;
  Reader type_00;
  Reader brand_00;
  Reader brand_01;
  StringPtr scopeName;
  StringPtr scopeName_00;
  StringPtr scopeName_01;
  Dependency *pDVar6;
  undefined4 uVar7;
  RemoveConst<capnp::_::RawBrandedSchema::Dependency> *pRVar8;
  unsigned_short uVar9;
  RawSchema *schema_00;
  anon_union_8_2_eba6ea51_for_Binding_4 aVar10;
  ulong uVar11;
  short sVar12;
  int iVar13;
  size_t sVar14;
  uint64_t uVar15;
  size_t sVar16;
  CapTableReader *pCVar17;
  ElementCount index;
  unsigned_long i;
  ulong uVar18;
  Dependency *__i;
  long lVar19;
  Dependency *pDVar20;
  Reader RVar21;
  ArrayPtr<const_capnp::_::RawBrandedSchema::Dependency> AVar22;
  StringPtr name;
  StringPtr scopeName_02;
  StringPtr scopeName_03;
  Vector<capnp::_::RawBrandedSchema::Dependency> deps;
  Binding binding;
  Reader superclass;
  Reader node;
  Reader superclasses;
  Vector<capnp::_::RawBrandedSchema::Dependency> local_278;
  StructReader local_258;
  ushort local_21a;
  Binding local_218;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_>_2
  *local_208;
  char *local_200;
  StructReader local_1f8;
  char *local_1c8;
  size_t sStack_1c0;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_1b8;
  int local_19c;
  StructReader local_198;
  long local_168;
  SegmentReader *local_160;
  CapTableReader *local_158;
  undefined1 local_150 [24];
  uint local_138;
  StructReader local_120;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  local_198.data = schema->encodedNode;
  local_198.segment = (SegmentReader *)0x0;
  local_198.capTable = (CapTableReader *)0x0;
  local_198.pointers._0_4_ = 0x7fffffff;
  pCVar17 = (CapTableReader *)0x0;
  _::PointerReader::getStruct(&local_258,(PointerReader *)&local_198,(word *)0x0);
  if (local_258.pointerCount == 0) {
    local_198.pointers._0_4_ = 0x7fffffff;
    local_198.data = (WirePointer *)0x0;
    local_258.segment = (SegmentReader *)0x0;
  }
  else {
    local_198.data = local_258.pointers;
    pCVar17 = local_258.capTable;
    local_198.pointers._0_4_ = local_258.nestingLimit;
  }
  local_198.segment = local_258.segment;
  local_198.capTable = pCVar17;
  RVar21 = _::PointerReader::getBlob<capnp::Text>((PointerReader *)&local_198,(void *)0x0,0);
  sVar14 = RVar21.super_StringPtr.content.size_;
  local_200 = RVar21.super_StringPtr.content.ptr;
  local_278.builder.ptr = (Dependency *)0x0;
  local_278.builder.pos = (Dependency *)0x0;
  local_278.builder.endPtr = (Dependency *)0x0;
  local_278.builder.disposer = (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  local_258.data = schema->encodedNode;
  local_258.segment = (SegmentReader *)0x0;
  local_258.capTable = (CapTableReader *)0x0;
  local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,0x7fffffff);
  _::PointerReader::getStruct(&local_198,(PointerReader *)&local_258,(word *)0x0);
  if (local_198.dataSize < 0x70) {
    uVar9 = 0;
  }
  else {
    uVar9 = (((WirePointer *)((long)local_198.data + 8))->field_1).structRef.dataSize.value;
  }
  if (uVar9 == 1) {
    if (local_198.pointerCount < 4) {
      local_198.nestingLimit = 0x7fffffff;
      local_258.capTable = (CapTableReader *)0x0;
      local_258.data = (word *)0x0;
      local_258.segment = (SegmentReader *)0x0;
    }
    else {
      local_258.data = (void *)(CONCAT44(local_198.pointers._4_4_,(int)local_198.pointers) + 0x18);
      local_258.capTable = local_198.capTable;
      local_258.segment = local_198.segment;
    }
    local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,local_198.nestingLimit);
    _::PointerReader::getList
              ((ListReader *)local_150,(PointerReader *)&local_258,INLINE_COMPOSITE,(word *)0x0);
    if ((ulong)local_138 != 0) {
      local_208 = &(bindings->ptr).field_1;
      uVar11 = 0;
      do {
        _::ListReader::getStructElement(&local_1f8,(ListReader *)local_150,(ElementCount)uVar11);
        if (local_1f8.dataSize < 0x50) {
          sVar12 = 0;
        }
        else {
          sVar12 = (short)*(uint64_t *)((long)local_1f8.data + 8);
        }
        if (sVar12 == 0) {
          if (local_1f8.pointerCount < 3) {
            iVar13 = 0x7fffffff;
            local_258.capTable = (CapTableReader *)0x0;
            local_258.data = (WirePointer *)0x0;
            local_258.segment = (SegmentReader *)0x0;
          }
          else {
            local_258.data = local_1f8.pointers + 2;
            local_258.capTable = local_1f8.capTable;
            local_258.segment = local_1f8.segment;
            iVar13 = local_1f8.nestingLimit;
          }
          local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar13);
          _::PointerReader::getStruct(&local_90,(PointerReader *)&local_258,(word *)0x0);
          local_1b8.ptr.isSet = (bindings->ptr).isSet;
          if (local_1b8.ptr.isSet == true) {
            local_1b8.ptr.field_1.value.ptr = (local_208->value).ptr;
            local_1b8.ptr.field_1.value.size_ = (local_208->value).size_;
          }
          local_258.nestingLimit = local_90.nestingLimit;
          local_258._44_4_ = local_90._44_4_;
          local_258.dataSize = local_90.dataSize;
          local_258.pointerCount = local_90.pointerCount;
          local_258._38_2_ = local_90._38_2_;
          local_258.pointers = local_90.pointers;
          local_258.data = local_90.data;
          local_258.capTable = local_90.capTable;
          local_258.segment = local_90.segment;
          local_218.which = '\0';
          local_218.isImplicitParameter = false;
          local_218.listDepth = 0;
          local_218.paramIndex = 0;
          local_218._6_2_ = 0;
          local_218.field_4.schema = (RawBrandedSchema *)0x0;
          type._reader.capTable = local_90.capTable;
          type._reader.segment = local_90.segment;
          type._reader.data = local_90.data;
          type._reader.pointers = local_90.pointers;
          type._reader.dataSize = local_90.dataSize;
          type._reader.pointerCount = local_90.pointerCount;
          type._reader._38_2_ = local_90._38_2_;
          type._reader.nestingLimit = local_90.nestingLimit;
          type._reader._44_4_ = local_90._44_4_;
          scopeName_02.content.size_ = sVar14;
          scopeName_02.content.ptr = local_200;
          makeDep(this,&local_218,type,scopeName_02,&local_1b8);
          aVar10 = local_218.field_4;
          if (local_218.field_4.schema != (RawBrandedSchema *)0x0) {
            if (local_278.builder.pos == local_278.builder.endPtr) {
              sVar16 = (long)local_278.builder.endPtr - (long)local_278.builder.ptr >> 3;
              if (local_278.builder.endPtr == local_278.builder.ptr) {
                sVar16 = 4;
              }
              kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar16);
            }
            goto LAB_0013ca8d;
          }
        }
        else if (sVar12 == 1) {
          if (local_1f8.dataSize < 0xc0) {
            uVar15 = 0;
          }
          else {
            uVar15 = *(uint64_t *)((long)local_1f8.data + 0x10);
          }
          name.content.size_ = 0x15;
          name.content.ptr = "(unknown group type)";
          schema_00 = loadEmpty(this,uVar15,name,STRUCT,true);
          if ((bindings->ptr).isSet == true) {
            aVar10.schema = makeBranded(this,schema_00,(bindings->ptr).field_1.value);
            if (aVar10.schema != (RawBrandedSchema *)0x0) {
              if (local_278.builder.pos == local_278.builder.endPtr) {
                sVar16 = (long)local_278.builder.endPtr - (long)local_278.builder.ptr >> 3;
                if (local_278.builder.endPtr == local_278.builder.ptr) {
                  sVar16 = 4;
                }
                kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar16);
              }
LAB_0013ca8d:
              *(undefined8 *)local_278.builder.pos = 0;
              (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
              *(undefined8 *)local_278.builder.pos = 0;
              (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
              (local_278.builder.pos)->location = (ElementCount)uVar11 | 0x1000000;
              (local_278.builder.pos)->schema = (RawBrandedSchema *)aVar10;
              local_278.builder.pos = local_278.builder.pos + 1;
            }
          }
          else {
            aVar10.schema = getUnbound(this,schema_00);
            if (aVar10.schema != (RawBrandedSchema *)0x0) {
              if (local_278.builder.pos == local_278.builder.endPtr) {
                sVar16 = (long)local_278.builder.endPtr - (long)local_278.builder.ptr >> 3;
                if (local_278.builder.endPtr == local_278.builder.ptr) {
                  sVar16 = 4;
                }
                kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar16);
              }
              goto LAB_0013ca8d;
            }
          }
        }
        uVar11 = uVar11 + 1;
      } while (local_138 != uVar11);
    }
  }
  else if (uVar9 == 3) {
    local_168 = CONCAT44(local_198.pointers._4_4_,(int)local_198.pointers);
    local_21a = local_198.pointerCount;
    if (local_198.pointerCount < 5) {
      iVar13 = 0x7fffffff;
      local_258.capTable = (CapTableReader *)0x0;
      local_258.data = (void *)0x0;
      local_258.segment = (SegmentReader *)0x0;
    }
    else {
      local_258.data = (void *)(local_168 + 0x20);
      local_258.capTable = local_198.capTable;
      local_258.segment = local_198.segment;
      iVar13 = local_198.nestingLimit;
    }
    local_160 = local_198.segment;
    local_19c = local_198.nestingLimit;
    local_158 = local_198.capTable;
    local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar13);
    _::PointerReader::getList
              ((ListReader *)local_150,(PointerReader *)&local_258,INLINE_COMPOSITE,(word *)0x0);
    uVar11 = (ulong)local_138;
    if (uVar11 != 0) {
      local_208 = &(bindings->ptr).field_1;
      uVar18 = 0;
      do {
        _::ListReader::getStructElement(&local_1f8,(ListReader *)local_150,(ElementCount)uVar18);
        if (local_1f8.dataSize < 0x40) {
          uVar15 = 0;
        }
        else {
          uVar15 = *local_1f8.data;
        }
        local_258.capTable = local_1f8.capTable;
        local_258.data = local_1f8.pointers;
        local_258.segment = local_1f8.segment;
        iVar13 = local_1f8.nestingLimit;
        if (local_1f8.pointerCount == 0) {
          local_258.capTable = (CapTableReader *)(RawBrandedSchema *)0x0;
          local_258.data = (WirePointer *)0x0;
          local_258.segment = (SegmentReader *)0x0;
          iVar13 = 0x7fffffff;
        }
        local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar13);
        _::PointerReader::getStruct(&local_c0,(PointerReader *)&local_258,(word *)0x0);
        local_1b8.ptr.isSet = (bindings->ptr).isSet;
        if (local_1b8.ptr.isSet == true) {
          local_1b8.ptr.field_1.value.ptr = (local_208->value).ptr;
          local_1b8.ptr.field_1.value.size_ = (local_208->value).size_;
        }
        local_258.segment = local_c0.segment;
        local_258.capTable = local_c0.capTable;
        local_258.data = local_c0.data;
        local_258.pointers = local_c0.pointers;
        local_258.dataSize = local_c0.dataSize;
        local_258.pointerCount = local_c0.pointerCount;
        local_258._38_2_ = local_c0._38_2_;
        local_258.nestingLimit = local_c0.nestingLimit;
        local_258._44_4_ = local_c0._44_4_;
        local_218.which = '\0';
        local_218.isImplicitParameter = false;
        local_218.listDepth = 0;
        local_218.paramIndex = 0;
        local_218._6_2_ = 0;
        local_218.field_4.schema = (RawBrandedSchema *)0x0;
        local_1c8 = local_200;
        brand._reader.capTable = local_c0.capTable;
        brand._reader.segment = local_c0.segment;
        brand._reader.data = local_c0.data;
        brand._reader.pointers = local_c0.pointers;
        brand._reader.dataSize = local_c0.dataSize;
        brand._reader.pointerCount = local_c0.pointerCount;
        brand._reader._38_2_ = local_c0._38_2_;
        brand._reader.nestingLimit = local_c0.nestingLimit;
        brand._reader._44_4_ = local_c0._44_4_;
        scopeName.content.size_ = sVar14;
        scopeName.content.ptr = local_200;
        sStack_1c0 = sVar14;
        makeDep(this,&local_218,uVar15,INTERFACE,INTERFACE,brand,scopeName,&local_1b8);
        aVar10 = local_218.field_4;
        if (local_218.field_4.schema != (RawBrandedSchema *)0x0) {
          if (local_278.builder.pos == local_278.builder.endPtr) {
            sVar16 = (long)local_278.builder.endPtr - (long)local_278.builder.ptr >> 3;
            if (local_278.builder.endPtr == local_278.builder.ptr) {
              sVar16 = 4;
            }
            kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar16);
          }
          *(undefined8 *)local_278.builder.pos = 0;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
          *(undefined8 *)local_278.builder.pos = 0;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
          (local_278.builder.pos)->location = (ElementCount)uVar18 | 0x4000000;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)aVar10;
          local_278.builder.pos = local_278.builder.pos + 1;
        }
        uVar18 = uVar18 + 1;
      } while (uVar11 != uVar18);
    }
    if (local_21a < 4) {
      iVar13 = 0x7fffffff;
      local_258.capTable = (CapTableReader *)0x0;
      local_258.data = (word *)0x0;
      local_258.segment = (SegmentReader *)0x0;
    }
    else {
      local_258.data = (void *)(local_168 + 0x18);
      local_258.capTable = local_158;
      local_258.segment = local_160;
      iVar13 = local_19c;
    }
    local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar13);
    _::PointerReader::getList
              ((ListReader *)local_150,(PointerReader *)&local_258,INLINE_COMPOSITE,(word *)0x0);
    if ((ulong)local_138 != 0) {
      local_208 = &(bindings->ptr).field_1;
      uVar11 = 0;
      do {
        index = (ElementCount)uVar11;
        _::ListReader::getStructElement(&local_1f8,(ListReader *)local_150,index);
        if (local_1f8.dataSize < 0x80) {
          uVar15 = 0;
        }
        else {
          uVar15 = *(uint64_t *)((long)local_1f8.data + 8);
        }
        if (local_1f8.pointerCount < 3) {
          iVar13 = 0x7fffffff;
          local_258.capTable = (CapTableReader *)0x0;
          local_258.data = (WirePointer *)0x0;
          local_258.segment = (SegmentReader *)0x0;
        }
        else {
          local_258.data = local_1f8.pointers + 2;
          local_258.capTable = local_1f8.capTable;
          local_258.segment = local_1f8.segment;
          iVar13 = local_1f8.nestingLimit;
        }
        local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar13);
        _::PointerReader::getStruct(&local_f0,(PointerReader *)&local_258,(word *)0x0);
        local_1b8.ptr.isSet = (bindings->ptr).isSet;
        if (local_1b8.ptr.isSet == true) {
          local_1b8.ptr.field_1.value.ptr = (local_208->value).ptr;
          local_1b8.ptr.field_1.value.size_ = (local_208->value).size_;
        }
        local_258.segment = local_f0.segment;
        local_258.capTable = local_f0.capTable;
        local_258.data = local_f0.data;
        local_258.pointers = local_f0.pointers;
        local_258.dataSize = local_f0.dataSize;
        local_258.pointerCount = local_f0.pointerCount;
        local_258._38_2_ = local_f0._38_2_;
        local_258.nestingLimit = local_f0.nestingLimit;
        local_258._44_4_ = local_f0._44_4_;
        local_218.which = '\0';
        local_218.isImplicitParameter = false;
        local_218.listDepth = 0;
        local_218.paramIndex = 0;
        local_218._6_2_ = 0;
        local_218.field_4.schema = (RawBrandedSchema *)0x0;
        local_1c8 = local_200;
        brand_00._reader.capTable = local_f0.capTable;
        brand_00._reader.segment = local_f0.segment;
        brand_00._reader.data = local_f0.data;
        brand_00._reader.pointers = local_f0.pointers;
        brand_00._reader.dataSize = local_f0.dataSize;
        brand_00._reader.pointerCount = local_f0.pointerCount;
        brand_00._reader._38_2_ = local_f0._38_2_;
        brand_00._reader.nestingLimit = local_f0.nestingLimit;
        brand_00._reader._44_4_ = local_f0._44_4_;
        scopeName_00.content.size_ = sVar14;
        scopeName_00.content.ptr = local_200;
        sStack_1c0 = sVar14;
        makeDep(this,&local_218,uVar15,STRUCT,STRUCT,brand_00,scopeName_00,&local_1b8);
        aVar10 = local_218.field_4;
        if (local_218.field_4.schema != (RawBrandedSchema *)0x0) {
          if (local_278.builder.pos == local_278.builder.endPtr) {
            sVar16 = (long)local_278.builder.endPtr - (long)local_278.builder.ptr >> 3;
            if (local_278.builder.endPtr == local_278.builder.ptr) {
              sVar16 = 4;
            }
            kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar16);
          }
          *(undefined8 *)local_278.builder.pos = 0;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
          *(undefined8 *)local_278.builder.pos = 0;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
          (local_278.builder.pos)->location = index | 0x2000000;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)aVar10;
          local_278.builder.pos = local_278.builder.pos + 1;
        }
        if (local_1f8.dataSize < 0xc0) {
          uVar15 = 0;
        }
        else {
          uVar15 = *(uint64_t *)((long)local_1f8.data + 0x10);
        }
        if (local_1f8.pointerCount < 4) {
          iVar13 = 0x7fffffff;
          local_258.capTable = (CapTableReader *)0x0;
          local_258.data = (WirePointer *)0x0;
          local_258.segment = (SegmentReader *)0x0;
        }
        else {
          local_258.data = local_1f8.pointers + 3;
          local_258.capTable = local_1f8.capTable;
          local_258.segment = local_1f8.segment;
          iVar13 = local_1f8.nestingLimit;
        }
        local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,iVar13);
        _::PointerReader::getStruct(&local_120,(PointerReader *)&local_258,(word *)0x0);
        local_1b8.ptr.isSet = (bindings->ptr).isSet;
        if (local_1b8.ptr.isSet == true) {
          local_1b8.ptr.field_1.value.ptr = (local_208->value).ptr;
          local_1b8.ptr.field_1.value.size_ = (local_208->value).size_;
        }
        local_258.segment = local_120.segment;
        local_258.capTable = local_120.capTable;
        local_258.data = local_120.data;
        local_258.pointers = local_120.pointers;
        local_258.dataSize = local_120.dataSize;
        local_258.pointerCount = local_120.pointerCount;
        local_258._38_2_ = local_120._38_2_;
        local_258.nestingLimit = local_120.nestingLimit;
        local_258._44_4_ = local_120._44_4_;
        local_218.which = '\0';
        local_218.isImplicitParameter = false;
        local_218.listDepth = 0;
        local_218.paramIndex = 0;
        local_218._6_2_ = 0;
        local_218.field_4.schema = (RawBrandedSchema *)0x0;
        local_1c8 = local_200;
        brand_01._reader.capTable = local_120.capTable;
        brand_01._reader.segment = local_120.segment;
        brand_01._reader.data = local_120.data;
        brand_01._reader.pointers = local_120.pointers;
        brand_01._reader.dataSize = local_120.dataSize;
        brand_01._reader.pointerCount = local_120.pointerCount;
        brand_01._reader._38_2_ = local_120._38_2_;
        brand_01._reader.nestingLimit = local_120.nestingLimit;
        brand_01._reader._44_4_ = local_120._44_4_;
        scopeName_01.content.size_ = sVar14;
        scopeName_01.content.ptr = local_200;
        sStack_1c0 = sVar14;
        makeDep(this,&local_218,uVar15,STRUCT,STRUCT,brand_01,scopeName_01,&local_1b8);
        aVar10 = local_218.field_4;
        if (local_218.field_4.schema != (RawBrandedSchema *)0x0) {
          if (local_278.builder.pos == local_278.builder.endPtr) {
            sVar16 = (long)local_278.builder.endPtr - (long)local_278.builder.ptr >> 3;
            if (local_278.builder.endPtr == local_278.builder.ptr) {
              sVar16 = 4;
            }
            kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar16);
          }
          *(undefined8 *)local_278.builder.pos = 0;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
          *(undefined8 *)local_278.builder.pos = 0;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
          (local_278.builder.pos)->location = index | 0x3000000;
          (local_278.builder.pos)->schema = (RawBrandedSchema *)aVar10;
          local_278.builder.pos = local_278.builder.pos + 1;
        }
        uVar11 = uVar11 + 1;
      } while (local_138 != uVar11);
    }
  }
  else if (uVar9 == 4) {
    if (local_198.pointerCount < 4) {
      local_198.nestingLimit = 0x7fffffff;
      local_258.capTable = (CapTableReader *)0x0;
      local_258.data = (void *)0x0;
      local_258.segment = (SegmentReader *)0x0;
    }
    else {
      local_258.data = (void *)(CONCAT44(local_198.pointers._4_4_,(int)local_198.pointers) + 0x18);
      local_258.capTable = local_198.capTable;
      local_258.segment = local_198.segment;
    }
    local_258.pointers = (WirePointer *)CONCAT44(local_258.pointers._4_4_,local_198.nestingLimit);
    _::PointerReader::getStruct(&local_60,(PointerReader *)&local_258,(word *)0x0);
    local_150[0] = (bindings->ptr).isSet;
    if (local_150[0] == true) {
      local_150._8_8_ = (bindings->ptr).field_1.value.ptr;
      local_150._16_8_ = (bindings->ptr).field_1.value.size_;
    }
    local_258.nestingLimit = local_60.nestingLimit;
    local_258._44_4_ = local_60._44_4_;
    local_258.dataSize = local_60.dataSize;
    local_258.pointerCount = local_60.pointerCount;
    local_258._38_2_ = local_60._38_2_;
    local_258.pointers = local_60.pointers;
    local_258.data = local_60.data;
    local_258.capTable = local_60.capTable;
    local_258.segment = local_60.segment;
    local_1f8.segment = (SegmentReader *)0x0;
    local_1f8.capTable = (CapTableReader *)0x0;
    type_00._reader.capTable = local_60.capTable;
    type_00._reader.segment = local_60.segment;
    type_00._reader.data = local_60.data;
    type_00._reader.pointers = local_60.pointers;
    type_00._reader.dataSize = local_60.dataSize;
    type_00._reader.pointerCount = local_60.pointerCount;
    type_00._reader._38_2_ = local_60._38_2_;
    type_00._reader.nestingLimit = local_60.nestingLimit;
    type_00._reader._44_4_ = local_60._44_4_;
    scopeName_03.content.size_ = sVar14;
    scopeName_03.content.ptr = local_200;
    makeDep(this,(Binding *)&local_1f8,type_00,scopeName_03,
            (Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> *)local_150);
    pCVar17 = local_1f8.capTable;
    if ((RawBrandedSchema *)local_1f8.capTable != (RawBrandedSchema *)0x0) {
      if (local_278.builder.pos == local_278.builder.endPtr) {
        sVar14 = 4;
        if (local_278.builder.endPtr != local_278.builder.ptr) {
          sVar14 = (long)local_278.builder.endPtr - (long)local_278.builder.ptr >> 3;
        }
        kj::Vector<capnp::_::RawBrandedSchema::Dependency>::setCapacity(&local_278,sVar14);
      }
      *(undefined8 *)local_278.builder.pos = 0;
      (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
      *(undefined8 *)local_278.builder.pos = 0;
      (local_278.builder.pos)->schema = (RawBrandedSchema *)0x0;
      (local_278.builder.pos)->location = 0x5000000;
      (local_278.builder.pos)->schema = (RawBrandedSchema *)pCVar17;
      local_278.builder.pos = local_278.builder.pos + 1;
    }
  }
  pRVar8 = local_278.builder.pos;
  pDVar6 = local_278.builder.ptr;
  if (local_278.builder.ptr != local_278.builder.pos) {
    lVar19 = (long)local_278.builder.pos - (long)local_278.builder.ptr;
    uVar11 = lVar19 >> 4;
    lVar4 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<capnp::_::RawBrandedSchema::Dependency*,long,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
              (local_278.builder.ptr,local_278.builder.pos,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar19 < 0x101) {
      std::
      __insertion_sort<capnp::_::RawBrandedSchema::Dependency*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (pDVar6,pRVar8);
    }
    else {
      pDVar20 = pDVar6 + 0x10;
      std::
      __insertion_sort<capnp::_::RawBrandedSchema::Dependency*,__gnu_cxx::__ops::_Iter_comp_iter<capnp::SchemaLoader::Impl::makeBrandedDependencies(capnp::_::RawSchema_const*,kj::Maybe<kj::ArrayPtr<capnp::_::RawBrandedSchema::Scope_const>>)::__0>>
                (pDVar6,pDVar20);
      for (; pDVar20 != pRVar8; pDVar20 = pDVar20 + 1) {
        uVar2 = pDVar20->location;
        uVar3 = *(undefined4 *)((long)&pDVar20->schema + 4);
        local_258.capTable = (CapTableReader *)CONCAT44(local_258.capTable._4_4_,uVar3);
        local_258.segment = *(SegmentReader **)&pDVar20->field_0x4;
        uVar1 = pDVar20[-1].location;
        pDVar6 = pDVar20;
        while (uVar2 < uVar1) {
          uVar7 = *(undefined4 *)&pDVar6[-1].field_0x4;
          pRVar5 = pDVar6[-1].schema;
          pDVar6->location = pDVar6[-1].location;
          *(undefined4 *)&pDVar6->field_0x4 = uVar7;
          pDVar6->schema = pRVar5;
          uVar1 = pDVar6[-2].location;
          pDVar6 = pDVar6 + -1;
        }
        pDVar6->location = uVar2;
        *(SegmentReader **)&pDVar6->field_0x4 = local_258.segment;
        *(undefined4 *)((long)&pDVar6->schema + 4) = uVar3;
      }
    }
  }
  AVar22.size_ = (long)local_278.builder.pos - (long)local_278.builder.ptr >> 4;
  AVar22.ptr = local_278.builder.ptr;
  AVar22 = copyDeduped<capnp::_::RawBrandedSchema::Dependency>(this,AVar22);
  pDVar20 = local_278.builder.endPtr;
  pRVar8 = local_278.builder.pos;
  pDVar6 = local_278.builder.ptr;
  if (local_278.builder.ptr != (Dependency *)0x0) {
    local_278.builder.ptr = (Dependency *)0x0;
    local_278.builder.pos = (RemoveConst<capnp::_::RawBrandedSchema::Dependency> *)0x0;
    local_278.builder.endPtr = (Dependency *)0x0;
    (*(code *)**(undefined8 **)local_278.builder.disposer)
              (local_278.builder.disposer,pDVar6,0x10,(long)pRVar8 - (long)pDVar6 >> 4,
               (long)pDVar20 - (long)pDVar6 >> 4,0);
  }
  return AVar22;
}

Assistant:

kj::ArrayPtr<const _::RawBrandedSchema::Dependency>
SchemaLoader::Impl::makeBrandedDependencies(
    const _::RawSchema* schema,
    kj::Maybe<kj::ArrayPtr<const _::RawBrandedSchema::Scope>> bindings) {
  kj::StringPtr scopeName =
      readMessageUnchecked<schema::Node>(schema->encodedNode).getDisplayName();

  kj::Vector<_::RawBrandedSchema::Dependency> deps;

  schema::Node::Reader node = readMessageUnchecked<schema::Node>(schema->encodedNode);

#define ADD_ENTRY(kind, index, make) \
    if (const _::RawBrandedSchema* dep = make) { \
      auto& slot = deps.add(); \
      memset(&slot, 0, sizeof(slot)); \
      slot.location = _::RawBrandedSchema::makeDepLocation( \
        _::RawBrandedSchema::DepKind::kind, index); \
      slot.schema = dep; \
    }

  switch (node.which()) {
    case schema::Node::FILE:
    case schema::Node::ENUM:
    case schema::Node::ANNOTATION:
      break;

    case schema::Node::CONST:
      ADD_ENTRY(CONST_TYPE, 0, makeDepSchema(
          node.getConst().getType(), scopeName, bindings));
      break;

    case schema::Node::STRUCT: {
      auto fields = node.getStruct().getFields();
      for (auto i: kj::indices(fields)) {
        auto field = fields[i];
        switch (field.which()) {
          case schema::Field::SLOT:
            ADD_ENTRY(FIELD, i, makeDepSchema(
                field.getSlot().getType(), scopeName, bindings))
            break;
          case schema::Field::GROUP: {
            const _::RawSchema* group = loadEmpty(
                field.getGroup().getTypeId(),
                "(unknown group type)", schema::Node::STRUCT, true);
            KJ_IF_SOME(b, bindings) {
              ADD_ENTRY(FIELD, i, makeBranded(group, b));
            } else {
              ADD_ENTRY(FIELD, i, getUnbound(group));
            }
            break;
          }
        }
      }
      break;
    }

    case schema::Node::INTERFACE: {
      auto interface = node.getInterface();
      {
        auto superclasses = interface.getSuperclasses();
        for (auto i: kj::indices(superclasses)) {
          auto superclass = superclasses[i];
          ADD_ENTRY(SUPERCLASS, i, makeDepSchema(
              superclass.getId(), schema::Type::INTERFACE, schema::Node::INTERFACE,
              superclass.getBrand(), scopeName, bindings))
        }
      }
      {
        auto methods = interface.getMethods();
        for (auto i: kj::indices(methods)) {
          auto method = methods[i];
          ADD_ENTRY(METHOD_PARAMS, i, makeDepSchema(
              method.getParamStructType(), schema::Type::STRUCT, schema::Node::STRUCT,
              method.getParamBrand(), scopeName, bindings))
          ADD_ENTRY(METHOD_RESULTS, i, makeDepSchema(
              method.getResultStructType(), schema::Type::STRUCT, schema::Node::STRUCT,
              method.getResultBrand(), scopeName, bindings))
        }
      }
      break;
    }
  }